

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_0,_0>
       ::run(redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
             *mat,scalar_sum_op<double,_double> *func)

{
  bool bVar1;
  long lVar2;
  Index IVar3;
  redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  *in_RSI;
  Index j;
  Index i_1;
  Index i;
  Scalar res;
  Index in_stack_ffffffffffffff88;
  redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  *in_stack_ffffffffffffff90;
  redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  *prVar4;
  CoeffReturnType local_40;
  long local_38;
  long local_30;
  CoeffReturnType local_28;
  long local_20;
  CoeffReturnType local_18;
  redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  *local_10;
  
  local_10 = in_RSI;
  IVar3 = redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
          ::rows((redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                  *)0x1690c8);
  bVar1 = false;
  if (0 < IVar3) {
    IVar3 = redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
            ::cols((redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                    *)0x1690e1);
    bVar1 = false;
    if (0 < IVar3) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("mat.rows()>0 && mat.cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/Redux.h"
                  ,0xc0,
                  "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::internal::redux_evaluator<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<double>, Derived = Eigen::internal::redux_evaluator<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>, Traversal = 0, Unrolling = 0]"
                 );
  }
  local_18 = redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
             ::coeffByOuterInner(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0x169134);
  local_20 = 1;
  while( true ) {
    lVar2 = local_20;
    IVar3 = redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
            ::innerSize((redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                         *)0x169157);
    prVar4 = local_10;
    if (IVar3 <= lVar2) break;
    local_28 = redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::coeffByOuterInner(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0x169181);
    local_18 = scalar_sum_op<double,_double>::operator()
                         ((scalar_sum_op<double,_double> *)prVar4,&local_18,&local_28);
    local_20 = local_20 + 1;
  }
  local_30 = 1;
  while( true ) {
    lVar2 = local_30;
    IVar3 = redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
            ::outerSize((redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                         *)0x1691ce);
    if (IVar3 <= lVar2) break;
    local_38 = 0;
    while( true ) {
      lVar2 = local_38;
      IVar3 = redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
              ::innerSize((redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                           *)0x1691fc);
      if (IVar3 <= lVar2) break;
      prVar4 = local_10;
      local_40 = redux_evaluator<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
                 ::coeffByOuterInner(local_10,in_stack_ffffffffffffff88,0x169227);
      local_18 = scalar_sum_op<double,_double>::operator()
                           ((scalar_sum_op<double,_double> *)prVar4,&local_18,&local_40);
      local_38 = local_38 + 1;
    }
    local_30 = local_30 + 1;
  }
  return local_18;
}

Assistant:

Scalar run(const Derived &mat, const Func& func)
  {
    eigen_assert(mat.rows()>0 && mat.cols()>0 && "you are using an empty matrix");
    Scalar res;
    res = mat.coeffByOuterInner(0, 0);
    for(Index i = 1; i < mat.innerSize(); ++i)
      res = func(res, mat.coeffByOuterInner(0, i));
    for(Index i = 1; i < mat.outerSize(); ++i)
      for(Index j = 0; j < mat.innerSize(); ++j)
        res = func(res, mat.coeffByOuterInner(i, j));
    return res;
  }